

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElifStatement.cpp
# Opt level: O0

void __thiscall
hdc::ElifStatement::ElifStatement
          (ElifStatement *this,Expression *expression,CompoundStatement *statements,
          ElseStatement *elseStatement)

{
  ElseStatement *elseStatement_local;
  CompoundStatement *statements_local;
  Expression *expression_local;
  ElifStatement *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00221cb8;
  this->expression = expression;
  this->statements = statements;
  this->elifStatement = (ElifStatement *)0x0;
  this->elseStatement = elseStatement;
  this->symbolTable = (SymbolTable *)0x0;
  ASTNode::setKind((ASTNode *)this,AST_ELIF);
  return;
}

Assistant:

hdc::ElifStatement::ElifStatement(hdc::Expression* expression, hdc::CompoundStatement* statements, hdc::ElseStatement* elseStatement) {
    this->expression = expression;
    this->statements = statements;
    this->elifStatement = nullptr;
    this->elseStatement = elseStatement;
    this->symbolTable = nullptr;
    setKind(AST_ELIF);
}